

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_PackedExtensions_Test::TestBody
          (GeneratedMessageReflectionTest_PackedExtensions_Test *this)

{
  Descriptor *base_descriptor;
  undefined1 local_d0 [8];
  ReflectionTester reflection_tester;
  undefined1 local_40 [8];
  TestPackedExtensions message;
  GeneratedMessageReflectionTest_PackedExtensions_Test *this_local;
  
  message.field_0._24_8_ = this;
  proto2_unittest::TestPackedExtensions::TestPackedExtensions((TestPackedExtensions *)local_40);
  TestUtil::SetPackedExtensions<proto2_unittest::TestPackedExtensions>
            ((TestPackedExtensions *)local_40);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>
            ((TestPackedExtensions *)local_40);
  proto2_unittest::TestPackedExtensions::Clear((TestPackedExtensions *)local_40);
  base_descriptor = proto2_unittest::TestPackedExtensions::descriptor();
  TestUtil::ReflectionTester::ReflectionTester((ReflectionTester *)local_d0,base_descriptor);
  TestUtil::ReflectionTester::SetPackedFieldsViaReflection
            ((ReflectionTester *)local_d0,(Message *)local_40);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>
            ((TestPackedExtensions *)local_40);
  TestUtil::ReflectionTester::ExpectPackedFieldsSetViaReflection
            ((ReflectionTester *)local_d0,(Message *)local_40);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions((TestPackedExtensions *)local_40);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, PackedExtensions) {
  // Set every extension to a unique value then go back and check all those
  // values.
  unittest::TestPackedExtensions message;

  // First set the extensions via the generated API (see b/366468123).
  TestUtil::SetPackedExtensions(&message);
  TestUtil::ExpectPackedExtensionsSet(message);
  message.Clear();

  TestUtil::ReflectionTester reflection_tester(
      unittest::TestPackedExtensions::descriptor());

  reflection_tester.SetPackedFieldsViaReflection(&message);
  TestUtil::ExpectPackedExtensionsSet(message);
  reflection_tester.ExpectPackedFieldsSetViaReflection(message);
}